

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seekforintruder.cpp
# Opt level: O3

bool sfi::logic::validateAddr(string *addr)

{
  int iVar1;
  char *__nptr;
  istream *piVar2;
  int *piVar3;
  ulong uVar4;
  undefined8 uVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  vector<int,_std::allocator<int>_> octets;
  exception e;
  string oct;
  istringstream ss;
  int local_1fc;
  vector<int,_std::allocator<int>_> local_1f8;
  char *local_1d8;
  char *local_1d0;
  undefined8 local_1c8;
  char local_1c0 [16];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  if (addr->_M_string_length < 0x10) {
    local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)addr,_S_in);
    local_1d0 = local_1c0;
    local_1c8 = 0;
    local_1c0[0] = '\0';
    while (piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)local_1b0,(string *)&local_1d0,'.'), __nptr = local_1d0,
          ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      *piVar3 = 0;
      uVar4 = strtoul(__nptr,&local_1d8,10);
      if (local_1d8 == __nptr) {
        std::__throw_invalid_argument("stoul");
LAB_00104d21:
        uVar5 = std::__throw_out_of_range("stoul");
        if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar5);
      }
      if (*piVar3 == 0) {
        *piVar3 = iVar1;
      }
      else if (*piVar3 == 0x22) goto LAB_00104d21;
      local_1fc = (int)uVar4;
      if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_1f8,
                   (iterator)
                   local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_1fc);
      }
      else {
        *local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_1fc;
        local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    uVar4 = (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    if (uVar4 < 4) {
      bVar7 = false;
    }
    else if ((*local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start - 0x100U < 0xffffff01) ||
            (0xfe < local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar4 - 1])) {
      bVar7 = false;
    }
    else {
      lVar6 = 0;
      do {
        bVar7 = local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6 + 1] < 0x100;
        if (0xff < local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6 + 1]) break;
        bVar8 = uVar4 - 3 != lVar6;
        lVar6 = lVar6 + 1;
      } while (bVar8);
    }
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0);
    }
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
    if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

static bool sfi::logic::validateAddr(const string& addr){
    if(addr.length() > 15)
        return false;
    vector<int>octets;
    istringstream ss(addr);
    string oct;
    while(getline(ss,oct,'.')){
        try {
            octets.push_back(stoul(oct));
        } catch (exception e) {
            return false;
        }
    }

    if(octets.size() < 4)
        return false;

    if(octets[0] > 255 || octets[0] < 1)
        return false;

    if(octets[octets.size()-1] > 254)
        return false;

    for(int i = 1 ; i < octets.size()-1 ; i++){
        if(octets[i] > 255)
            return false;
    }
    return true;
}